

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<short,char,5>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (short *lhs,char *rhs,short *result)

{
  short sVar1;
  int iVar2;
  undefined2 *in_RDX;
  char *in_RSI;
  short *in_RDI;
  int32_t tmp;
  
  iVar2 = (int)*in_RDI + (int)*in_RSI;
  sVar1 = std::numeric_limits<short>::max();
  if (iVar2 <= sVar1) {
    sVar1 = std::numeric_limits<short>::min();
    if (sVar1 <= iVar2) {
      *in_RDX = (short)iVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }